

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group_Type.cxx
# Opt level: O2

Fl_Widget * __thiscall Fl_Tabs_Type::enter_live_mode(Fl_Tabs_Type *this,int param_1)

{
  int iVar1;
  Fl_Tabs *this_00;
  Fl_Widget *pFVar2;
  Fl_Type *pFVar3;
  
  this_00 = (Fl_Tabs *)operator_new(200);
  pFVar2 = (this->super_Fl_Group_Type).super_Fl_Widget_Type.o;
  Fl_Tabs::Fl_Tabs(this_00,pFVar2->x_,pFVar2->y_,pFVar2->w_,pFVar2->h_,(char *)0x0);
  (this->super_Fl_Group_Type).super_Fl_Widget_Type.live_widget = (Fl_Widget *)this_00;
  (*(this->super_Fl_Group_Type).super_Fl_Widget_Type.super_Fl_Type._vptr_Fl_Type[0x15])(this);
  pFVar3 = (Fl_Type *)this;
  while (pFVar3 = pFVar3->next, pFVar3 != (Fl_Type *)0x0) {
    iVar1 = (this->super_Fl_Group_Type).super_Fl_Widget_Type.super_Fl_Type.level;
    if (pFVar3->level <= iVar1) break;
    if (pFVar3->level == iVar1 + 1) {
      (*pFVar3->_vptr_Fl_Type[0x13])(pFVar3,0);
    }
  }
  Fl_Group::end((Fl_Group *)this_00);
  pFVar2 = Fl_Tabs::value((Fl_Tabs *)(this->super_Fl_Group_Type).super_Fl_Widget_Type.o);
  Fl_Tabs::value(this_00,pFVar2);
  return (this->super_Fl_Group_Type).super_Fl_Widget_Type.live_widget;
}

Assistant:

Fl_Widget *Fl_Tabs_Type::enter_live_mode(int) {
  Fl_Tabs *grp = new Fl_Tabs(o->x(), o->y(), o->w(), o->h());
  live_widget = grp;
  if (live_widget) {
    copy_properties();
    Fl_Type *n;
    for (n = next; n && n->level > level; n = n->next) {
      if (n->level == level+1)
        n->enter_live_mode();
    }
    grp->end();
  }
  grp->value(((Fl_Tabs*)o)->value());
  return live_widget;
}